

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

int anon_unknown.dwarf_101ce38::MapVersionToIndex(int version)

{
  if (version < 0x14a) {
    if (version < 0x8c) {
      if (version < 0x78) {
        if (version == 100) {
          return 0;
        }
        if (version == 0x6e) {
          return 1;
        }
      }
      else {
        if (version == 0x78) {
          return 2;
        }
        if (version == 0x82) {
          return 3;
        }
      }
    }
    else if (version < 300) {
      if (version == 0x8c) {
        return 4;
      }
      if (version == 0x96) {
        return 5;
      }
    }
    else {
      if (version == 300) {
        return 6;
      }
      if (version == 0x136) {
        return 0xd;
      }
      if (version == 0x140) {
        return 0xf;
      }
    }
  }
  else if (version < 0x1ae) {
    if (version < 0x19a) {
      if (version == 0x14a) {
        return 7;
      }
      if (version == 400) {
        return 8;
      }
    }
    else {
      if (version == 0x19a) {
        return 9;
      }
      if (version == 0x1a4) {
        return 10;
      }
    }
  }
  else if (version < 0x1c2) {
    if (version == 0x1ae) {
      return 0xb;
    }
    if (version == 0x1b8) {
      return 0xc;
    }
  }
  else {
    if (version == 0x1c2) {
      return 0xe;
    }
    if (version == 0x1cc) {
      return 0x10;
    }
    if (version == 500) {
      return 0;
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                ,0xa0,"int (anonymous namespace)::MapVersionToIndex(int)");
}

Assistant:

int MapVersionToIndex(int version)
{
    int index = 0;

    switch (version) {
    case 100: index =  0; break;
    case 110: index =  1; break;
    case 120: index =  2; break;
    case 130: index =  3; break;
    case 140: index =  4; break;
    case 150: index =  5; break;
    case 300: index =  6; break;
    case 330: index =  7; break;
    case 400: index =  8; break;
    case 410: index =  9; break;
    case 420: index = 10; break;
    case 430: index = 11; break;
    case 440: index = 12; break;
    case 310: index = 13; break;
    case 450: index = 14; break;
    case 500: index =  0; break; // HLSL
    case 320: index = 15; break;
    case 460: index = 16; break;
    default:  assert(0);  break;
    }

    assert(index < VersionCount);

    return index;
}